

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTests(Config *config)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  long lVar6;
  pointer this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  ulong local_b8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  TestSpec local_80;
  string local_50;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec(&local_80,(TestSpec *)CONCAT44(extraout_var,iVar2));
  poVar5 = std::operator<<((ostream *)&std::cout,"name\tgroup");
  std::endl<char,std::char_traits<char>>(poVar5);
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests(&local_b0,testCases,&local_80,&config->super_IConfig);
  local_b8 = ((long)local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xb8;
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x13])(config);
  pp_Var1 = (config->super_IConfig).super_NonCopyable._vptr_NonCopyable;
  uStack_90 = 0;
  local_98 = local_b8;
  if (iVar2 < 0) {
    iVar2 = (*pp_Var1[0x14])(config);
    if (iVar2 < 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])(config);
      iVar2 = (int)((((double)CONCAT44(0x45300000,local_98._4_4_) - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(undefined4)local_98) - 4503599627370496.0)) *
                   ((double)iVar2 / 100.0));
    }
  }
  else {
    iVar2 = (*pp_Var1[0x13])(config);
  }
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x15])(config);
  pp_Var1 = (config->super_IConfig).super_NonCopyable._vptr_NonCopyable;
  if (iVar3 < 0) {
    iVar3 = (*pp_Var1[0x16])(config);
    if (-1 < iVar3) {
      iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x16])(config);
      local_b8 = (ulong)(uint)(int)((((double)CONCAT44(0x45300000,local_98._4_4_) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(undefined4)local_98) -
                                    4503599627370496.0)) * ((double)iVar3 / 100.0));
    }
  }
  else {
    uVar4 = (*pp_Var1[0x15])(config);
    local_b8 = (ulong)uVar4;
  }
  lVar6 = -(long)local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  iVar3 = 0;
  for (this = local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
              .super__Vector_impl_data._M_start;
      this != local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
              .super__Vector_impl_data._M_finish; this = this + 1) {
    if ((iVar2 <= iVar3) && (iVar3 < (int)local_b8)) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)this);
      std::operator<<(poVar5,"\t");
      if ((this->super_TestCaseInfo).tags.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->super_TestCaseInfo).tags.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        TestCaseInfo::tagsAsString_abi_cxx11_(&local_50,&this->super_TestCaseInfo);
        std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    iVar3 = iVar3 + 1;
    lVar6 = lVar6 + -0xb8;
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_b0);
  TestSpec::~TestSpec(&local_80);
  return -((long)&((local_b0.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).name._M_dataplus.
                  _M_p + lVar6) / 0xb8;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        Catch::cout() << "name\tgroup" << std::endl;

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        auto total_tests_run = matchedTestCases.size();
        int start_offset = 0;
        int end_offset = total_tests_run;
        if (config.startOffset() >= 0) {
            start_offset = config.startOffset();
        } else if (config.startOffsetPercentage() >= 0) {
            start_offset = int((config.startOffsetPercentage() / 100.0) * total_tests_run);
        }
        if (config.endOffset() >= 0) {
            end_offset = config.endOffset();
        } else if (config.endOffsetPercentage() >= 0) {
            end_offset = int((config.endOffsetPercentage() / 100.0) * total_tests_run);
        }
        auto it = matchedTestCases.begin();
        for(int current_test = 0; it != matchedTestCases.end(); current_test++) {
            if (current_test < start_offset || current_test >= end_offset) {
                // skip this test
                it++;
                continue;
            }
            auto &testCaseInfo = *it;
            Catch::cout() << testCaseInfo.name << "\t";
            if( !testCaseInfo.tags.empty() ) {
                Catch::cout() << testCaseInfo.tagsAsString();
            }
            Catch::cout() << std::endl;
            it++;
        }
        return matchedTestCases.size();
    }